

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_ui.cpp
# Opt level: O2

void InitWarning(bilingual_str *str)

{
  string *this;
  long in_FS_OFFSET;
  allocator<char> local_39;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this = &local_38;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  CClientUIInterface::ThreadSafeMessageBox((CClientUIInterface *)this,str,&local_38,0x10000401);
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void InitWarning(const bilingual_str& str)
{
    uiInterface.ThreadSafeMessageBox(str, "", CClientUIInterface::MSG_WARNING);
}